

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testFutureProofing.cpp
# Opt level: O0

void anon_unknown.dwarf_16af90::setOutputDeepFrameBuffer
               (DeepFrameBuffer *frameBuffer,int pixelType,Array2D<unsigned_int_*> *uData,
               Array2D<float_*> *fData,Array2D<Imath_3_2::half_*> *hData,int width)

{
  uint **ppuVar1;
  float **ppfVar2;
  half **pphVar3;
  Array2D<float_*> *in_RCX;
  Array2D<unsigned_int_*> *in_RDX;
  int in_ESI;
  char *in_RDI;
  Array2D<Imath_3_2::half_*> *in_R8;
  int in_R9D;
  DeepSlice local_d8 [56];
  DeepSlice local_a0 [56];
  DeepSlice local_68 [60];
  int local_2c;
  
  local_2c = in_R9D;
  if (in_ESI == 0) {
    ppuVar1 = Imf_3_2::Array2D<unsigned_int_*>::operator[](in_RDX,0);
    Imf_3_2::DeepSlice::DeepSlice
              (local_68,UINT,(char *)ppuVar1,8,(long)local_2c << 3,4,1,1,0.0,false,false);
    Imf_3_2::DeepFrameBuffer::insert(in_RDI,(DeepSlice *)"UINT");
  }
  else if (in_ESI == 1) {
    ppfVar2 = Imf_3_2::Array2D<float_*>::operator[](in_RCX,0);
    Imf_3_2::DeepSlice::DeepSlice
              (local_a0,FLOAT,(char *)ppfVar2,8,(long)local_2c << 3,4,1,1,0.0,false,false);
    Imf_3_2::DeepFrameBuffer::insert(in_RDI,(DeepSlice *)"FLOAT");
  }
  else if (in_ESI == 2) {
    pphVar3 = Imf_3_2::Array2D<Imath_3_2::half_*>::operator[](in_R8,0);
    Imf_3_2::DeepSlice::DeepSlice
              (local_d8,HALF,(char *)pphVar3,8,(long)local_2c << 3,2,1,1,0.0,false,false);
    Imf_3_2::DeepFrameBuffer::insert(in_RDI,(DeepSlice *)"HALF");
  }
  return;
}

Assistant:

void
setOutputDeepFrameBuffer (
    DeepFrameBuffer&        frameBuffer,
    int                     pixelType,
    Array2D<unsigned int*>& uData,
    Array2D<float*>&        fData,
    Array2D<half*>&         hData,
    int                     width)
{
    switch (pixelType)
    {
        case 0:
            frameBuffer.insert (
                "UINT",
                DeepSlice (
                    IMF::UINT,
                    (char*) (&uData[0][0]),
                    sizeof (uData[0][0]) * 1,
                    sizeof (uData[0][0]) * width,
                    sizeof (unsigned int)));
            break;
        case 1:
            frameBuffer.insert (
                "FLOAT",
                DeepSlice (
                    IMF::FLOAT,
                    (char*) (&fData[0][0]),
                    sizeof (fData[0][0]) * 1,
                    sizeof (fData[0][0]) * width,
                    sizeof (float)));
            break;
        case 2:
            frameBuffer.insert (
                "HALF",
                DeepSlice (
                    IMF::HALF,
                    (char*) (&hData[0][0]),
                    sizeof (hData[0][0]) * 1,
                    sizeof (hData[0][0]) * width,
                    sizeof (half)));
            break;
    }
}